

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_cps(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *s_00;
  TCGTemp *ts;
  
  s_00 = s->uc->tcg_ctx;
  ts = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
  tcg_gen_andi_i64_s390x(s_00,(TCGv_i64)((long)ts - (long)s_00),o->in1,-0x8000000000000000);
  tcg_gen_andi_i64_s390x(s_00,o->out,o->in2,0x7fffffffffffffff);
  tcg_gen_op3_s390x(s_00,INDEX_op_or_i64,(TCGArg)(o->out + (long)s_00),(TCGArg)(o->out + (long)s_00)
                    ,(TCGArg)ts);
  tcg_temp_free_internal_s390x(s_00,ts);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_cps(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_andi_i64(tcg_ctx, t, o->in1, 0x8000000000000000ull);
    tcg_gen_andi_i64(tcg_ctx, o->out, o->in2, 0x7fffffffffffffffull);
    tcg_gen_or_i64(tcg_ctx, o->out, o->out, t);
    tcg_temp_free_i64(tcg_ctx, t);
    return DISAS_NEXT;
}